

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

void r8poly_print(int n,double *a,string *title)

{
  char cVar1;
  ostream *poVar2;
  char *pcVar3;
  ulong uVar4;
  double dVar5;
  
  if (title->_M_string_length != 0) {
    std::operator<<((ostream *)&std::cout,"\n");
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)title);
    std::operator<<(poVar2,"\n");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  if (n < 0) {
    std::operator<<((ostream *)&std::cout,"  p(x) = 0\n");
    return;
  }
  uVar4 = (ulong)(uint)n;
  cVar1 = ' ';
  if (a[uVar4] < 0.0) {
    cVar1 = '-';
  }
  dVar5 = ABS(a[uVar4]);
  if ((uint)n < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"  p(x) = ");
    poVar2 = std::operator<<(poVar2,cVar1);
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0xe;
    poVar2 = std::ostream::_M_insert<double>(dVar5);
    if (n == 1) {
      pcVar3 = " * x\n";
      goto LAB_001c7254;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"  p(x) = ");
    poVar2 = std::operator<<(poVar2,cVar1);
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0xe;
    poVar2 = std::ostream::_M_insert<double>(dVar5);
    poVar2 = std::operator<<(poVar2," * x ^ ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,n);
  }
  pcVar3 = "\n";
LAB_001c7254:
  std::operator<<(poVar2,pcVar3);
  do {
    if (uVar4 == 0) {
      return;
    }
    dVar5 = a[uVar4 - 1 & 0xffffffff];
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      cVar1 = (dVar5 < 0.0) * '\x02' + '+';
      if (uVar4 < 3) {
        poVar2 = std::operator<<((ostream *)&std::cout,"         ");
        poVar2 = std::operator<<(poVar2,cVar1);
        *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0xe;
        poVar2 = std::ostream::_M_insert<double>(ABS(dVar5));
        if ((int)uVar4 != 2) goto LAB_001c733c;
        pcVar3 = " * x\n";
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"         ");
        poVar2 = std::operator<<(poVar2,cVar1);
        *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 0xe;
        poVar2 = std::ostream::_M_insert<double>(ABS(dVar5));
        poVar2 = std::operator<<(poVar2," * x ^ ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)(uVar4 - 1));
LAB_001c733c:
        pcVar3 = "\n";
      }
      std::operator<<(poVar2,pcVar3);
    }
    uVar4 = uVar4 - 1;
  } while( true );
}

Assistant:

void r8poly_print ( int n, double a[], std::string title )

//****************************************************************************80
//
//  Purpose:
//
//    R8POLY_PRINT prints out a polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 July 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the dimension of A.
//
//    Input, double A[N+1], the polynomial coefficients.
//    A(0) is the constant term and
//    A(N) is the coefficient of X^N.
//
//    Input, string TITLE, a title.
//
{
  int i;
  double mag;
  char plus_minus;

  if ( 0 < title.length ( ) )
  {
    std::cout << "\n";
    std::cout << title << "\n";
  }
  std::cout << "\n";

  if ( n < 0 )
  {
    std::cout << "  p(x) = 0\n";
    return;
  }

  if ( a[n] < 0.0 )
  {
    plus_minus = '-';
  }
  else
  {
    plus_minus = ' ';
  }

  mag = fabs ( a[n] );

  if ( 2 <= n )
  {
    std::cout << "  p(x) = " << plus_minus
         << std::setw(14) << mag << " * x ^ " << n << "\n";
  }
  else if ( n == 1 )
  {
    std::cout << "  p(x) = " << plus_minus
         << std::setw(14) << mag << " * x\n";
  }
  else if ( n == 0 )
  {
    std::cout << "  p(x) = " << plus_minus
         << std::setw(14) << mag << "\n";
  }

  for ( i = n - 1; 0 <= i; i-- )
  {
    if ( a[i] < 0.0 )
    {
      plus_minus = '-';
    }
    else
    {
      plus_minus = '+';
    }

    mag = fabs ( a[i] );

    if ( mag != 0.0 )
    {
      if ( 2 <= i )
      {
        std::cout << "         " << plus_minus
             << std::setw(14) << mag << " * x ^ " << i << "\n";
      }
      else if ( i == 1 )
      {
        std::cout << "         " << plus_minus
             << std::setw(14) << mag << " * x\n";
      }
      else if ( i == 0 )
      {
        std::cout << "         " << plus_minus
             << std::setw(14) << mag << "\n";
      }
    }
  }

  return;
}